

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderPerformanceMeasurer.cpp
# Opt level: O2

void __thiscall
deqp::gls::ShaderPerformanceMeasurer::render(ShaderPerformanceMeasurer *this,int numDrawCalls)

{
  int iVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  
  iVar3 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  iVar1 = this->m_gridSizeX;
  iVar2 = this->m_gridSizeY;
  (**(code **)(CONCAT44(extraout_var,iVar3) + 0x1a00))
            (0,0,this->m_viewportWidth,this->m_viewportHeight);
  if (numDrawCalls < 1) {
    numDrawCalls = 0;
  }
  while (numDrawCalls != 0) {
    (**(code **)(CONCAT44(extraout_var,iVar3) + 0x568))(4,iVar1 * iVar2 * 6,0x1403,0);
    numDrawCalls = numDrawCalls + -1;
  }
  return;
}

Assistant:

void ShaderPerformanceMeasurer::render (int numDrawCalls)
{
	const glw::Functions&	gl			= m_renderCtx.getFunctions();
	GLsizei					numIndices	= (GLsizei)getNumIndices(m_gridSizeX, m_gridSizeY);

	gl.viewport(0, 0, m_viewportWidth, m_viewportHeight);

	for (int callNdx = 0; callNdx < numDrawCalls; callNdx++)
		gl.drawElements(GL_TRIANGLES, numIndices, GL_UNSIGNED_SHORT, DE_NULL);
}